

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O0

ostream * operator<<(ostream *os,vector3 *vv)

{
  ostream *poVar1;
  vector3 *vv_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"<");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,vv->x);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,vv->y);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,vv->z);
  std::operator<<(poVar1,"> ");
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const vector3& vv)
{
  os << "<" << vv.x << "," << vv.y << "," << vv.z << "> ";
  return os;
}